

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::UpdateRegionForBlock(FlowGraph *this,BasicBlock *block)

{
  Type pSVar1;
  code *pcVar2;
  Func **ppFVar3;
  bool bVar4;
  BOOL BVar5;
  LabelInstr *pLVar6;
  undefined4 *puVar7;
  Type *ppFVar8;
  long lVar9;
  BasicBlock *pBVar10;
  LabelInstr *pLVar11;
  Type pSVar12;
  long lVar13;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar14;
  Instr *this_00;
  BasicBlock *pBVar15;
  Instr *local_60;
  Instr *tryInstr;
  undefined1 local_50 [8];
  Iterator __iter;
  BasicBlock *block_local;
  Region *region;
  
  local_60 = (Instr *)0x0;
  this_00 = block->firstInstr;
  __iter.current = (NodeBase *)block;
  if (((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) &&
     (pLVar6 = IR::Instr::AsLabelInstr(this_00), pLVar6->m_region != (Region *)0x0)) {
    BVar5 = Func::HasTry(this->func);
    if (BVar5 != 0) {
      bVar4 = Func::DoOptimizeTry(this->func);
      if (bVar4) {
        return;
      }
      bVar4 = Func::IsSimpleJit(this->func);
      if ((bVar4) && ((this->func->field_0x240 & 0x10) != 0)) {
        return;
      }
      bVar4 = Func::IsLoopBodyInTryFinally(this->func);
      if (bVar4) {
        return;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x77c,"(assignRegionsBeforeGlobopt)","assignRegionsBeforeGlobopt");
    if (bVar4) {
      *puVar7 = 0;
      return;
    }
    goto LAB_003f7a91;
  }
  if (this->blockList == block) {
    pBVar15 = (BasicBlock *)0x0;
    block_local = (BasicBlock *)Region::New(RegionTypeRoot,(Region *)0x0,this->func);
LAB_003f7886:
    if (block_local != (BasicBlock *)0x0) goto LAB_003f788b;
  }
  else {
    block_local = (BasicBlock *)0x0;
    pSVar14 = &(block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    tryInstr = this_00;
    local_50 = (undefined1  [8])pSVar14;
    __iter.list = pSVar14;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    do {
      if (pSVar14 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_003f7a91;
        *puVar7 = 0;
        pSVar14 = __iter.list;
      }
      pSVar14 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pSVar14->super_SListNodeBase<Memory::ArenaAllocator>)->
                super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])pSVar14 == local_50) {
        pBVar15 = (BasicBlock *)0x0;
        goto LAB_003f774e;
      }
      __iter.list = pSVar14;
      ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_50);
      pBVar10 = (*ppFVar8)->predBlock;
      if (pBVar10 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78a,"(predBlock)","predBlock");
        if (!bVar4) goto LAB_003f7a91;
        *puVar7 = 0;
      }
      if (this->blockCount <= pBVar10->number) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x78c,"(predBlock->GetBlockNum() < this->blockCount)",
                           "Misnumbered block at teardown time?");
        if (!bVar4) goto LAB_003f7a91;
        *puVar7 = 0;
      }
      pLVar6 = IR::Instr::AsLabelInstr(pBVar10->firstInstr);
      pBVar15 = (BasicBlock *)pLVar6->m_region;
      pSVar14 = __iter.list;
    } while (pBVar15 == (BasicBlock *)0x0);
    block_local = (BasicBlock *)
                  PropagateRegionFromPred
                            (this,(BasicBlock *)__iter.current,pBVar10,(Region *)pBVar15,&local_60);
LAB_003f774e:
    pSVar1 = (__iter.current)->next;
    pSVar12 = pSVar1 + 0x38;
    if (pSVar1 == (Type)0x0) {
      pSVar12 = __iter.current + 0x41;
    }
    lVar13 = 0x18;
    lVar9 = 0xd0;
    if (pSVar1 != (Type)0x0) {
      lVar9 = lVar13;
    }
    this_00 = tryInstr;
    if (((*(ushort *)(*(long *)((long)&pSVar12->next->next + lVar9) + 0x30) & 0xfffe) != 0xea) ||
       (this->regToFinallyEndMap ==
        (BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0)) goto LAB_003f7886;
    if (*(char *)&block_local->next == '\x04') {
      if (*(BasicBlock **)
           &(block_local->loop->blockList).
            super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount ==
          block_local) {
        bVar4 = JsUtil::
                BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(this->regToFinallyEndMap,(Region **)&block_local);
        if ((bVar4) &&
           (pBVar10 = JsUtil::
                      BaseDictionary<Region_*,_BasicBlock_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::Item(this->regToFinallyEndMap,(Region **)&block_local),
           pBVar10 != (BasicBlock *)0x0)) {
          ppFVar3 = (Func **)&pBVar10->next->firstInstr;
          if (pBVar10->next == (BasicBlock *)0x0) {
            lVar13 = 0xd0;
            ppFVar3 = &pBVar10->func;
          }
          if ((*(short *)(*(long *)((long)&(*ppFVar3)->m_alloc + lVar13) + 0x30) == 0xea) &&
             ((BasicBlock *)__iter.current != pBVar10)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x7a1,
                               "(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally)"
                               ,
                               "endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally"
                              );
            if (!bVar4) goto LAB_003f7a91;
            *puVar7 = 0;
          }
          JsUtil::
          BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                    ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->regToFinallyEndMap,(Region **)&block_local,
                     (BasicBlock **)&__iter.current);
          this_00 = tryInstr;
        }
        else {
          JsUtil::
          BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->regToFinallyEndMap,(Region **)&block_local,
                     (BasicBlock **)&__iter.current);
          this_00 = tryInstr;
        }
      }
      goto LAB_003f7886;
    }
LAB_003f788b:
    if (block_local->excludeByteCodeUpwardExposedTracking ==
        (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Region::AllocateEHBailoutData((Region *)block_local,this->func,local_60);
    }
  }
  if ((this_00->m_kind != InstrKindLabel) && (this_00->m_kind != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x7ad,"(firstInstr->IsLabelInstr())","firstInstr->IsLabelInstr()");
    if (!bVar4) {
LAB_003f7a91:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    if ((this_00->m_kind != InstrKindProfiledLabel) && (this_00->m_kind != InstrKindLabel)) {
      return;
    }
  }
  pLVar6 = IR::Instr::AsLabelInstr(this_00);
  pLVar6->m_region = (Region *)block_local;
  if (block_local == pBVar15) {
    if ((pLVar6->field_0x78 & 4) == 0) {
      pSVar14 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)(__iter.current + 0x39);
      local_50 = (undefined1  [8])pSVar14;
      __iter.list = pSVar14;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      do {
        if (pSVar14 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) goto LAB_003f7a91;
          *puVar7 = 0;
          pSVar14 = __iter.list;
        }
        __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                      (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                       &pSVar14->super_SListNodeBase<Memory::ArenaAllocator>)->
                      super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_50) {
          return;
        }
        ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)local_50);
        pBVar15 = (*ppFVar8)->predBlock;
        if (pBVar15 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7bf,"(predBlock)","predBlock");
          if (!bVar4) goto LAB_003f7a91;
          *puVar7 = 0;
        }
        if (this->blockCount <= pBVar15->number) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x7c1,"(predBlock->GetBlockNum() < this->blockCount)",
                             "Misnumbered block at teardown time?");
          if (!bVar4) goto LAB_003f7a91;
          *puVar7 = 0;
        }
        pLVar11 = IR::Instr::AsLabelInstr(pBVar15->firstInstr);
        pSVar14 = __iter.list;
      } while ((BasicBlock *)pLVar11->m_region == block_local);
      pLVar6->field_0x78 = pLVar6->field_0x78 | 4;
    }
  }
  else {
    pLVar6->field_0x78 = pLVar6->field_0x78 | 4;
  }
  return;
}

Assistant:

void
FlowGraph::UpdateRegionForBlock(BasicBlock * block)
{
    Region *region;
    Region * predRegion = nullptr;
    IR::Instr * tryInstr = nullptr;
    IR::Instr * firstInstr = block->GetFirstInstr();
    if (firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->GetRegion())
    {
#if DBG
        bool assignRegionsBeforeGlobopt = this->func->HasTry() && (this->func->DoOptimizeTry() ||
        (this->func->IsSimpleJit() && this->func->hasBailout) ||
        this->func->IsLoopBodyInTryFinally());
        Assert(assignRegionsBeforeGlobopt);
#endif
        return;
    }

    if (block == this->blockList)
    {
        // Head of the graph: create the root region.
        region = Region::New(RegionTypeRoot, nullptr, this->func);
    }
    else
    {
        // Propagate the region forward by finding a predecessor we've already processed.
        region = nullptr;
        FOREACH_PREDECESSOR_BLOCK(predBlock, block)
        {
            AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
            predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
            if (predRegion != nullptr)
            {
                region = this->PropagateRegionFromPred(block, predBlock, predRegion, tryInstr);
                break;
            }
        }
        NEXT_PREDECESSOR_BLOCK;

        if (block->GetLastInstr()->m_opcode == Js::OpCode::LeaveNull || block->GetLastInstr()->m_opcode == Js::OpCode::Leave)
        {
            if (this->regToFinallyEndMap && region->IsNonExceptingFinally())
            {
                BasicBlock *endOfFinally = regToFinallyEndMap->ContainsKey(region) ? regToFinallyEndMap->Item(region) : nullptr;
                if (!endOfFinally)
                {
                    regToFinallyEndMap->Add(region, block);
                }
                else
                {
                    Assert(endOfFinally->GetLastInstr()->m_opcode != Js::OpCode::LeaveNull || block == endOfFinally);
                    regToFinallyEndMap->Item(region, block);
                }
            }
        }
    }

    if (region && !region->ehBailoutData)
    {
        region->AllocateEHBailoutData(this->func, tryInstr);
    }

    Assert(firstInstr->IsLabelInstr());
    if (firstInstr->IsLabelInstr())
    {
        // Record the region on the label and make sure it stays around as a region
        // marker if we're entering a region at this point.
        IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
        labelInstr->SetRegion(region);
        if (region != predRegion)
        {
            labelInstr->m_hasNonBranchRef = true;
        }

        // One of the pred blocks maybe an eh region, in that case it is important to mark this label's m_hasNonBranchRef
        // If not later in codegen, this label can get deleted. And during SccLiveness, region is propagated to newly created labels in lowerer from the previous label's region
        // We can end up assigning an eh region to a label in a non eh region. And if there is a bailout in such a region, bad things will happen in the interpreter :)
        // See test2()/test3() in tryfinallytests.js
        if (!labelInstr->m_hasNonBranchRef)
        {
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                AssertMsg(predBlock->GetBlockNum() < this->blockCount, "Misnumbered block at teardown time?");
                predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predRegion != region)
                {
                    labelInstr->m_hasNonBranchRef = true;
                    break;
                }
            }
            NEXT_PREDECESSOR_BLOCK;
        }
    }
}